

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpacceptor.cpp
# Opt level: O1

int __thiscall TCPAcceptor::start(TCPAcceptor *this)

{
  ushort uVar1;
  int iVar2;
  char *__s;
  sockaddr_in address;
  int optval;
  sockaddr local_28;
  undefined4 local_14;
  
  iVar2 = 0;
  if (this->m_listening == false) {
    iVar2 = socket(2,1,0);
    this->m_lsd = iVar2;
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    uVar1 = (ushort)this->m_port;
    local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
    local_28.sa_family = 2;
    local_28.sa_data._2_4_ = 0;
    if ((this->m_address)._M_string_length == 0) {
      local_28.sa_data._2_4_ = 0;
    }
    else {
      inet_pton(2,(this->m_address)._M_dataplus._M_p,local_28.sa_data + 2);
    }
    local_14 = 1;
    setsockopt(this->m_lsd,1,2,&local_14,4);
    iVar2 = bind(this->m_lsd,&local_28,0x10);
    if (iVar2 == 0) {
      iVar2 = listen(this->m_lsd,5);
      if (iVar2 == 0) {
        this->m_listening = true;
        return 0;
      }
      __s = "listen() failed";
    }
    else {
      __s = "bind() failed";
    }
    perror(__s);
  }
  return iVar2;
}

Assistant:

int TCPAcceptor::start()
{
    if (m_listening) {
        return 0;
    }

    m_lsd = socket(PF_INET, SOCK_STREAM, 0);
    struct sockaddr_in address;

    memset(&address, 0, sizeof(address));
    address.sin_family = PF_INET;
    address.sin_port = htons(m_port);
    if (m_address.size() > 0) {
        inet_pton(PF_INET, m_address.c_str(), &(address.sin_addr));
    }
    else {
        address.sin_addr.s_addr = INADDR_ANY;
    }

    int optval = 1;
    setsockopt(m_lsd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof optval);

    int result = ::bind(m_lsd, (struct sockaddr*)&address, sizeof(address));
    if (result != 0) {
        perror("bind() failed");
        return result;
    }

    result = listen(m_lsd, 5);
    if (result != 0) {
        perror("listen() failed");
        return result;
    }
    m_listening = true;
    return result;
}